

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_2_1_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  float *data;
  ulong uVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  float *pfVar32;
  long lVar33;
  float *pfVar34;
  int iVar35;
  float *pfVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  int k;
  int iVar40;
  long lVar41;
  int k_count;
  int iVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  undefined1 auVar72 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  int data_width;
  
  auVar53._8_4_ = 0x80000000;
  auVar53._0_8_ = 0x8000000080000000;
  auVar53._12_4_ = 0x80000000;
  auVar54._8_4_ = 0x3effffff;
  auVar54._0_8_ = 0x3effffff3effffff;
  auVar54._12_4_ = 0x3effffff;
  fVar60 = ipoint->scale;
  auVar75 = ZEXT464((uint)fVar60);
  auVar46 = vpternlogd_avx512vl(auVar54,ZEXT416((uint)fVar60),auVar53,0xf8);
  auVar46 = ZEXT416((uint)(fVar60 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  iVar18 = (int)auVar46._0_4_;
  fVar59 = -0.08 / (fVar60 * fVar60);
  auVar47 = vpternlogd_avx512vl(auVar54,ZEXT416((uint)ipoint->x),auVar53,0xf8);
  auVar47 = ZEXT416((uint)(ipoint->x + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48._0_8_ = (double)auVar47._0_4_;
  auVar48._8_8_ = auVar47._8_8_;
  auVar52._0_8_ = (double)fVar60;
  auVar52._8_8_ = 0;
  auVar47 = vfmadd231sd_fma(auVar48,auVar52,ZEXT816(0x3fe0000000000000));
  auVar51._0_4_ = (float)auVar47._0_8_;
  auVar51._4_12_ = auVar47._4_12_;
  auVar47 = vpternlogd_avx512vl(auVar54,ZEXT416((uint)ipoint->y),auVar53,0xf8);
  auVar47 = ZEXT416((uint)(ipoint->y + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar49._0_8_ = (double)auVar47._0_4_;
  auVar49._8_8_ = auVar47._8_8_;
  auVar47 = vfmadd231sd_fma(auVar49,auVar52,ZEXT816(0x3fe0000000000000));
  auVar50._0_4_ = (float)auVar47._0_8_;
  auVar50._4_12_ = auVar47._4_12_;
  auVar47._0_4_ = (int)auVar46._0_4_;
  auVar47._4_4_ = (int)auVar46._4_4_;
  auVar47._8_4_ = (int)auVar46._8_4_;
  auVar47._12_4_ = (int)auVar46._12_4_;
  auVar46 = vcvtdq2ps_avx(auVar47);
  fVar3 = auVar51._0_4_ - auVar46._0_4_;
  fVar4 = auVar50._0_4_ - auVar46._0_4_;
  auVar46 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar60),auVar51);
  auVar47 = vpternlogd_avx512vl(auVar54,auVar46,auVar53,0xf8);
  auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar47._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = ZEXT416((uint)fVar60);
  if (iVar18 < (int)auVar46._0_4_) {
    auVar46 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar47,auVar50);
    auVar55._8_4_ = 0x3effffff;
    auVar55._0_8_ = 0x3effffff3effffff;
    auVar55._12_4_ = 0x3effffff;
    auVar56._8_4_ = 0x80000000;
    auVar56._0_8_ = 0x8000000080000000;
    auVar56._12_4_ = 0x80000000;
    auVar48 = vpternlogd_avx512vl(auVar56,auVar46,auVar55,0xea);
    auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar48._0_4_));
    auVar46 = vroundss_avx(auVar46,auVar46,0xb);
    if (iVar18 < (int)auVar46._0_4_) {
      auVar46 = vfmadd231ss_fma(auVar51,auVar47,ZEXT416(0x41300000));
      auVar57._8_4_ = 0x80000000;
      auVar57._0_8_ = 0x8000000080000000;
      auVar57._12_4_ = 0x80000000;
      auVar48 = vpternlogd_avx512vl(auVar57,auVar46,auVar55,0xea);
      auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar48._0_4_));
      auVar46 = vroundss_avx(auVar46,auVar46,0xb);
      if ((int)auVar46._0_4_ + iVar18 <= iimage->width) {
        auVar46 = vfmadd231ss_fma(auVar50,auVar47,ZEXT416(0x41300000));
        auVar16._8_4_ = 0x80000000;
        auVar16._0_8_ = 0x8000000080000000;
        auVar16._12_4_ = 0x80000000;
        auVar48 = vpternlogd_avx512vl(auVar55,auVar46,auVar16,0xf8);
        auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar48._0_4_));
        auVar46 = vroundss_avx(auVar46,auVar46,0xb);
        if ((int)auVar46._0_4_ + iVar18 <= iimage->height) {
          pfVar32 = iimage->data;
          iVar1 = iimage->data_width;
          iVar22 = iVar18 * 2;
          pfVar36 = haarResponseX;
          pfVar34 = haarResponseY;
          uVar19 = 0xfffffff4;
          do {
            auVar46._0_4_ = (float)(int)uVar19;
            auVar72 = in_ZMM8._4_12_;
            auVar46._4_12_ = auVar72;
            auVar46 = vfmadd213ss_fma(auVar46,auVar47,ZEXT416((uint)(fVar4 + 0.5)));
            iVar40 = (int)auVar46._0_4_;
            auVar68._0_4_ = (float)(int)(uVar19 | 1);
            auVar68._4_12_ = auVar72;
            auVar46 = vfmadd213ss_fma(auVar68,auVar47,ZEXT416((uint)(fVar4 + 0.5)));
            iVar42 = (int)auVar46._0_4_;
            iVar26 = (iVar40 + -1) * iVar1;
            iVar28 = (iVar40 + -1 + iVar18) * iVar1;
            iVar40 = (iVar40 + -1 + iVar22) * iVar1;
            iVar29 = (iVar42 + -1) * iVar1;
            iVar23 = (iVar42 + -1 + iVar18) * iVar1;
            iVar42 = (iVar42 + -1 + iVar22) * iVar1;
            lVar25 = 0;
            do {
              auVar69._0_4_ = (float)((int)lVar25 + -0xc);
              auVar69._4_12_ = auVar72;
              auVar46 = vfmadd213ss_fma(auVar69,auVar47,ZEXT416((uint)(fVar3 + 0.5)));
              iVar39 = (int)auVar46._0_4_;
              iVar30 = iVar39 + -1 + iVar18;
              iVar35 = iVar39 + -1 + iVar22;
              fVar60 = pfVar32[iVar28 + -1 + iVar39];
              fVar5 = pfVar32[iVar40 + -1 + iVar39];
              fVar6 = pfVar32[iVar40 + iVar35];
              fVar7 = pfVar32[iVar26 + -1 + iVar39];
              fVar8 = pfVar32[iVar26 + iVar35];
              auVar48 = SUB6416(ZEXT464(0x40000000),0);
              auVar46 = vfmadd213ss_fma(ZEXT416((uint)(pfVar32[iVar26 + iVar30] -
                                                      pfVar32[iVar40 + iVar30])),auVar48,
                                        ZEXT416((uint)(fVar6 - fVar7)));
              fVar65 = pfVar32[iVar28 + iVar35];
              pfVar36[lVar25] = (fVar5 - fVar8) + auVar46._0_4_;
              auVar46 = vfmadd213ss_fma(ZEXT416((uint)(fVar60 - fVar65)),auVar48,
                                        ZEXT416((uint)(fVar6 - fVar7)));
              pfVar34[lVar25] = auVar46._0_4_ - (fVar5 - fVar8);
              fVar60 = pfVar32[iVar23 + -1 + iVar39];
              fVar5 = pfVar32[iVar42 + -1 + iVar39];
              fVar6 = pfVar32[iVar35 + iVar42];
              fVar7 = pfVar32[iVar29 + -1 + iVar39];
              fVar8 = pfVar32[iVar29 + iVar35];
              fVar65 = pfVar32[iVar23 + iVar35];
              auVar46 = vfmadd213ss_fma(ZEXT416((uint)(pfVar32[iVar29 + iVar30] -
                                                      pfVar32[iVar30 + iVar42])),auVar48,
                                        ZEXT416((uint)(fVar6 - fVar7)));
              pfVar36[lVar25 + 0x18] = (fVar5 - fVar8) + auVar46._0_4_;
              auVar46 = vfmadd213ss_fma(ZEXT416((uint)(fVar60 - fVar65)),auVar48,
                                        ZEXT416((uint)(fVar6 - fVar7)));
              pfVar34[lVar25 + 0x18] = auVar46._0_4_ - (fVar5 - fVar8);
              lVar25 = lVar25 + 1;
            } while (lVar25 != 0x18);
            pfVar34 = pfVar34 + 0x30;
            pfVar36 = pfVar36 + 0x30;
            bVar2 = (int)uVar19 < 10;
            uVar19 = uVar19 + 2;
          } while (bVar2);
          goto LAB_001b87db;
        }
      }
    }
  }
  iVar1 = iVar18 * 2;
  lVar25 = 0;
  uVar19 = 0xfffffff4;
  do {
    auVar61._0_4_ = (float)(int)uVar19;
    auVar61._4_12_ = in_ZMM8._4_12_;
    auVar46 = vfmadd213ss_fma(auVar61,auVar75._0_16_,ZEXT416((uint)fVar4));
    auVar63._0_4_ = (float)(int)(uVar19 | 1);
    auVar63._4_12_ = in_ZMM8._4_12_;
    auVar48 = vfmadd213ss_fma(auVar63,auVar75._0_16_,ZEXT416((uint)fVar4));
    fVar60 = auVar46._0_4_;
    iVar22 = (int)((double)((ulong)(0.0 <= fVar60) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar60) * -0x4020000000000000) + (double)fVar60);
    fVar60 = auVar48._0_4_;
    iVar28 = (int)((double)((ulong)(0.0 <= fVar60) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar60) * -0x4020000000000000) + (double)fVar60);
    lVar44 = 0;
    iVar40 = -0xc;
    do {
      auVar62._0_4_ = (float)iVar40;
      auVar62._4_12_ = in_ZMM8._4_12_;
      auVar46 = vfmadd213ss_fma(auVar62,auVar75._0_16_,ZEXT416((uint)fVar3));
      fVar60 = auVar46._0_4_;
      pfVar32 = (float *)((long)haarResponseX + lVar44 + lVar25);
      pfVar36 = (float *)((long)haarResponseY + lVar44 + lVar25);
      iVar26 = (int)((double)((ulong)(0.0 <= fVar60) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar60) * -0x4020000000000000) + (double)fVar60);
      if ((((iVar22 < 1) || (iVar26 < 1)) || (iimage->height < iVar1 + iVar22)) ||
         (iVar42 = iVar1 + iVar26, iimage->width < iVar42)) {
        haarXY(iimage,iVar22,iVar26,iVar18,pfVar32,pfVar36);
      }
      else {
        iVar30 = iVar26 + -1 + iVar18;
        pfVar34 = iimage->data;
        iVar29 = iimage->data_width;
        iVar23 = iVar29 * (iVar22 + -1);
        iVar39 = iVar29 * (iVar22 + -1 + iVar18);
        fVar60 = pfVar34[iVar39 + -1 + iVar26];
        iVar29 = iVar29 * (iVar1 + -1 + iVar22);
        fVar5 = pfVar34[iVar29 + -1 + iVar26];
        fVar6 = pfVar34[iVar29 + -1 + iVar42];
        fVar7 = pfVar34[iVar23 + -1 + iVar26];
        fVar8 = pfVar34[iVar23 + -1 + iVar42];
        fVar65 = pfVar34[iVar39 + -1 + iVar42];
        auVar46 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar23 + iVar30] - pfVar34[iVar29 + iVar30]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar32 = (fVar5 - fVar8) + auVar46._0_4_;
        auVar46 = vfmadd213ss_fma(ZEXT416((uint)(fVar60 - fVar65)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar36 = auVar46._0_4_ - (fVar5 - fVar8);
      }
      pfVar32 = (float *)((long)haarResponseX + lVar44 + 0x60 + lVar25);
      pfVar36 = (float *)((long)haarResponseY + lVar44 + 0x60 + lVar25);
      if (((iVar28 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar1 + iVar28 || (iVar42 = iVar1 + iVar26, iimage->width < iVar42)))) {
        haarXY(iimage,iVar28,iVar26,iVar18,pfVar32,pfVar36);
      }
      else {
        iVar23 = iVar26 + -1 + iVar18;
        pfVar34 = iimage->data;
        iVar29 = iimage->data_width;
        iVar30 = iVar29 * (iVar28 + -1);
        iVar39 = iVar29 * (iVar28 + -1 + iVar18);
        fVar60 = pfVar34[iVar39 + -1 + iVar26];
        iVar29 = iVar29 * (iVar1 + -1 + iVar28);
        fVar5 = pfVar34[iVar29 + -1 + iVar26];
        fVar6 = pfVar34[iVar29 + -1 + iVar42];
        fVar7 = pfVar34[iVar30 + -1 + iVar26];
        fVar8 = pfVar34[iVar30 + -1 + iVar42];
        fVar65 = pfVar34[iVar39 + -1 + iVar42];
        auVar46 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar30 + iVar23] - pfVar34[iVar29 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar32 = (fVar5 - fVar8) + auVar46._0_4_;
        auVar46 = vfmadd213ss_fma(ZEXT416((uint)(fVar60 - fVar65)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar36 = auVar46._0_4_ - (fVar5 - fVar8);
      }
      auVar75 = ZEXT1664(auVar47);
      iVar40 = iVar40 + 1;
      lVar44 = lVar44 + 4;
    } while (lVar44 != 0x60);
    lVar25 = lVar25 + 0xc0;
    bVar2 = (int)uVar19 < 10;
    uVar19 = uVar19 + 2;
  } while (bVar2);
LAB_001b87db:
  fVar60 = auVar75._0_4_;
  auVar74._8_4_ = 0x3effffff;
  auVar74._0_8_ = 0x3effffff3effffff;
  auVar74._12_4_ = 0x3effffff;
  auVar73._8_4_ = 0x80000000;
  auVar73._0_8_ = 0x8000000080000000;
  auVar73._12_4_ = 0x80000000;
  auVar46 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar60 * 0.5)),auVar73,0xf8);
  auVar46 = ZEXT416((uint)(fVar60 * 0.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar60 * 1.5)),auVar73,0xf8);
  auVar47 = ZEXT416((uint)(fVar60 * 1.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar60 * 2.5)),auVar73,0xf8);
  auVar48 = ZEXT416((uint)(fVar60 * 2.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar60 * 3.5)),auVar73,0xf8);
  auVar49 = ZEXT416((uint)(fVar60 * 3.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar60 * 4.5)),auVar73,0xf8);
  auVar50 = ZEXT416((uint)(fVar60 * 4.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar60 * 5.5)),auVar73,0xf8);
  auVar51 = ZEXT416((uint)(fVar60 * 5.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar60 * 6.5)),auVar73,0xf8);
  auVar52 = ZEXT416((uint)(fVar60 * 6.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar60 * 7.5)),auVar73,0xf8);
  auVar53 = ZEXT416((uint)(auVar53._0_4_ + fVar60 * 7.5));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar60 * 8.5)),auVar73,0xf8);
  auVar54 = ZEXT416((uint)(fVar60 * 8.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar60 * 9.5)),auVar73,0xf8);
  auVar55 = ZEXT416((uint)(fVar60 * 9.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar60 * 10.5)),auVar73,0xf8);
  auVar56 = ZEXT416((uint)(fVar60 * 10.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar74,ZEXT416((uint)(fVar60 * 11.5)),auVar73,0xf8);
  auVar57 = ZEXT416((uint)(fVar60 * 11.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  fVar65 = auVar48._0_4_;
  fVar60 = fVar65 + auVar47._0_4_;
  fVar3 = fVar65 + auVar46._0_4_;
  fVar4 = fVar65 - auVar46._0_4_;
  fVar5 = fVar65 - auVar47._0_4_;
  fVar6 = fVar65 - auVar49._0_4_;
  fVar7 = fVar65 - auVar50._0_4_;
  fVar8 = fVar65 - auVar51._0_4_;
  fVar65 = fVar65 - auVar52._0_4_;
  fVar71 = auVar53._0_4_;
  fVar9 = fVar71 - auVar49._0_4_;
  fVar10 = fVar71 - auVar50._0_4_;
  fVar11 = fVar71 - auVar51._0_4_;
  fVar12 = fVar71 - auVar52._0_4_;
  fVar13 = fVar71 - auVar54._0_4_;
  fVar14 = fVar71 - auVar55._0_4_;
  fVar15 = fVar71 - auVar56._0_4_;
  fVar71 = fVar71 - auVar57._0_4_;
  gauss_s1_c0[0] = expf(fVar60 * fVar60 * fVar59);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar59);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar59);
  gauss_s1_c0[3] = expf(fVar5 * fVar5 * fVar59);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar6 * fVar6 * fVar59);
  gauss_s1_c0[6] = expf(fVar7 * fVar7 * fVar59);
  gauss_s1_c0[7] = expf(fVar8 * fVar8 * fVar59);
  gauss_s1_c0[8] = expf(fVar65 * fVar65 * fVar59);
  gauss_s1_c1[0] = expf(fVar9 * fVar9 * fVar59);
  gauss_s1_c1[1] = expf(fVar10 * fVar10 * fVar59);
  gauss_s1_c1[2] = expf(fVar11 * fVar11 * fVar59);
  gauss_s1_c1[3] = expf(fVar12 * fVar12 * fVar59);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar13 * fVar13 * fVar59);
  gauss_s1_c1[6] = expf(fVar14 * fVar14 * fVar59);
  gauss_s1_c1[7] = expf(fVar15 * fVar15 * fVar59);
  gauss_s1_c1[8] = expf(fVar71 * fVar71 * fVar59);
  uVar20 = 0xfffffff8;
  lVar25 = 0;
  fVar60 = 0.0;
  auVar64._8_4_ = 0x7fffffff;
  auVar64._0_8_ = 0x7fffffff7fffffff;
  auVar64._12_4_ = 0x7fffffff;
  lVar44 = 0;
  lVar37 = 0;
  do {
    pfVar32 = gauss_s1_c1;
    uVar19 = (uint)uVar20;
    if (uVar19 != 7) {
      pfVar32 = gauss_s1_c0;
    }
    if (uVar19 == 0xfffffff8) {
      pfVar32 = gauss_s1_c1;
    }
    lVar44 = (long)(int)lVar44;
    iVar18 = (int)lVar37;
    lVar37 = (long)iVar18;
    lVar33 = (long)haarResponseX + lVar25;
    lVar45 = (long)haarResponseY + lVar25;
    uVar31 = 0xfffffff8;
    uVar27 = 0;
    do {
      pfVar36 = gauss_s1_c1;
      if (uVar31 != 7) {
        pfVar36 = gauss_s1_c0;
      }
      if (uVar31 == 0xfffffff8) {
        pfVar36 = gauss_s1_c1;
      }
      uVar21 = (ulong)(uVar31 >> 0x1c & 0xfffffff8);
      auVar75 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar24 = uVar27;
      lVar41 = lVar33;
      lVar43 = lVar45;
      do {
        lVar38 = 0;
        pfVar34 = (float *)((long)pfVar32 + (ulong)(uint)((int)(uVar20 >> 0x1f) << 5));
        do {
          fVar3 = pfVar36[uVar21] * *pfVar34;
          auVar46 = vinsertps_avx(ZEXT416(*(uint *)(lVar43 + lVar38 * 4)),
                                  ZEXT416(*(uint *)(lVar41 + lVar38 * 4)),0x10);
          auVar70._0_4_ = fVar3 * auVar46._0_4_;
          auVar70._4_4_ = fVar3 * auVar46._4_4_;
          auVar70._8_4_ = fVar3 * auVar46._8_4_;
          auVar70._12_4_ = fVar3 * auVar46._12_4_;
          auVar46 = vandps_avx(auVar70,auVar64);
          auVar46 = vmovlhps_avx(auVar70,auVar46);
          auVar66._0_4_ = auVar75._0_4_ + auVar46._0_4_;
          auVar66._4_4_ = auVar75._4_4_ + auVar46._4_4_;
          auVar66._8_4_ = auVar75._8_4_ + auVar46._8_4_;
          auVar66._12_4_ = auVar75._12_4_ + auVar46._12_4_;
          auVar75 = ZEXT1664(auVar66);
          pfVar34 = pfVar34 + (ulong)(~uVar19 >> 0x1f) * 2 + -1;
          lVar38 = lVar38 + 1;
        } while (lVar38 != 9);
        uVar24 = uVar24 + 0x18;
        uVar21 = uVar21 + (ulong)(-1 < (int)uVar31) * 2 + -1;
        lVar41 = lVar41 + 0x60;
        lVar43 = lVar43 + 0x60;
      } while (uVar24 < uVar31 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar37];
      auVar17._4_4_ = fVar3;
      auVar17._0_4_ = fVar3;
      auVar17._8_4_ = fVar3;
      auVar17._12_4_ = fVar3;
      auVar48 = vmulps_avx512vl(auVar66,auVar17);
      lVar37 = lVar37 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar44) = auVar48;
      auVar67._0_4_ = auVar48._0_4_ * auVar48._0_4_;
      auVar67._4_4_ = auVar48._4_4_ * auVar48._4_4_;
      auVar67._8_4_ = auVar48._8_4_ * auVar48._8_4_;
      auVar67._12_4_ = auVar48._12_4_ * auVar48._12_4_;
      auVar46 = vmovshdup_avx(auVar67);
      auVar47 = vfmadd231ss_fma(auVar46,auVar48,auVar48);
      auVar46 = vshufpd_avx(auVar48,auVar48,1);
      auVar47 = vfmadd213ss_fma(auVar46,auVar46,auVar47);
      auVar46 = vshufps_avx(auVar48,auVar48,0xff);
      auVar46 = vfmadd213ss_fma(auVar46,auVar46,auVar47);
      fVar60 = fVar60 + auVar46._0_4_;
      lVar44 = lVar44 + 4;
      uVar31 = uVar31 + 5;
      uVar27 = uVar27 + 0x78;
      lVar33 = lVar33 + 0x1e0;
      lVar45 = lVar45 + 0x1e0;
    } while (iVar18 + 4 != (int)lVar37);
    lVar25 = lVar25 + 0x14;
    uVar20 = (ulong)(uVar19 + 5);
  } while ((int)uVar19 < 3);
  if (fVar60 < 0.0) {
    fVar60 = sqrtf(fVar60);
  }
  else {
    auVar46 = vsqrtss_avx(ZEXT416((uint)fVar60),ZEXT416((uint)fVar60));
    fVar60 = auVar46._0_4_;
  }
  auVar75 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar60)));
  lVar25 = 0;
  do {
    auVar58 = vmulps_avx512f(auVar75,*(undefined1 (*) [64])(ipoint->descriptor + lVar25));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar25) = auVar58;
    lVar25 = lVar25 + 0x10;
  } while (lVar25 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_1_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}